

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O3

ALCenum alcGetError(ALCdevice *_device)

{
  uint32 x;
  DeviceWrapper *device;
  
  device = &null_device;
  if (_device != (ALCdevice *)0x0) {
    device = (DeviceWrapper *)_device;
  }
  APILOCK();
  IO_ENTRYINFO(ALEE_alcGetError);
  IO_UINT64((uint64)_device);
  x = device->errorlatch;
  device->errorlatch = 0;
  writele32(x);
  check_alc_error_events(device);
  check_al_async_states();
  APIUNLOCK();
  return x;
}

Assistant:

ALCenum alcGetError(ALCdevice *_device)
{
    DeviceWrapper *device = _device ? (DeviceWrapper *) _device : &null_device;
    ALCenum retval;
    IO_START(alcGetError);
    IO_PTR(_device);
    retval = device->errorlatch;
    device->errorlatch = ALC_NO_ERROR;
    IO_ALCENUM(retval);
    IO_END_ALC(device);
    return retval;
}